

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O3

void __thiscall
QHttpNetworkRequestPrivate::~QHttpNetworkRequestPrivate(QHttpNetworkRequestPrivate *this)

{
  Data *pDVar1;
  Data *pDVar2;
  
  pDVar1 = (this->peerVerifyName).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->peerVerifyName).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar1 = (this->fullLocalServerName).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->fullLocalServerName).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar2 = (this->customVerb).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->customVerb).d.d)->super_QArrayData,1,0x10);
    }
  }
  pDVar1 = (this->super_QHttpNetworkHeaderPrivate).parser.reasonPhrase.d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate
                (&((this->super_QHttpNetworkHeaderPrivate).parser.reasonPhrase.d.d)->
                  super_QArrayData,2,0x10);
    }
  }
  QHttpHeaders::~QHttpHeaders(&(this->super_QHttpNetworkHeaderPrivate).parser.fields);
  QUrl::~QUrl(&(this->super_QHttpNetworkHeaderPrivate).url);
  return;
}

Assistant:

QHttpNetworkRequestPrivate::~QHttpNetworkRequestPrivate()
{
}